

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

int remove(char *__filename)

{
  float fVar1;
  ulong *puVar2;
  svm_example *psVar3;
  svm_example *psVar4;
  ostream *poVar5;
  void *this;
  svm_example **ppsVar6;
  float *pfVar7;
  size_t sVar8;
  ulong in_RSI;
  size_t i_1;
  size_t rowsize;
  svm_example *e;
  size_t j;
  int alloc;
  size_t i;
  svm_example *svi_e;
  svm_model *model;
  svm_example *in_stack_ffffffffffffffb0;
  ulong i_00;
  ulong local_38;
  int local_2c;
  ulong local_28;
  
  puVar2 = *(ulong **)(__filename + 0x38);
  if (*puVar2 <= in_RSI) {
    poVar5 = std::operator<<((ostream *)(*(long *)(__filename + 0x88) + 0xe0),"Internal error at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    this = (void *)std::ostream::operator<<(poVar5,0x1cd);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  ppsVar6 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar2 + 1),in_RSI);
  psVar3 = *ppsVar6;
  for (local_28 = in_RSI; local_28 < *puVar2 - 1; local_28 = local_28 + 1) {
    ppsVar6 = v_array<svm_example_*>::operator[]
                        ((v_array<svm_example_*> *)(puVar2 + 1),local_28 + 1);
    psVar4 = *ppsVar6;
    ppsVar6 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar2 + 1),local_28);
    *ppsVar6 = psVar4;
    pfVar7 = v_array<float>::operator[]((v_array<float> *)(puVar2 + 5),local_28 + 1);
    fVar1 = *pfVar7;
    pfVar7 = v_array<float>::operator[]((v_array<float> *)(puVar2 + 5),local_28);
    *pfVar7 = fVar1;
    pfVar7 = v_array<float>::operator[]((v_array<float> *)(puVar2 + 9),local_28 + 1);
    fVar1 = *pfVar7;
    pfVar7 = v_array<float>::operator[]((v_array<float> *)(puVar2 + 9),local_28);
    *pfVar7 = fVar1;
  }
  svm_example::~svm_example(in_stack_ffffffffffffffb0);
  free(psVar3);
  v_array<svm_example_*>::pop((v_array<svm_example_*> *)(puVar2 + 1));
  v_array<float>::pop((v_array<float> *)(puVar2 + 5));
  v_array<float>::pop((v_array<float> *)(puVar2 + 9));
  *puVar2 = *puVar2 - 1;
  local_2c = 0;
  for (local_38 = 0; local_38 < *puVar2; local_38 = local_38 + 1) {
    ppsVar6 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar2 + 1),local_38);
    psVar3 = *ppsVar6;
    sVar8 = v_array<float>::size(&psVar3->krow);
    i_00 = in_RSI;
    if (in_RSI < sVar8) {
      for (; i_00 < sVar8 - 1; i_00 = i_00 + 1) {
        pfVar7 = v_array<float>::operator[](&psVar3->krow,i_00 + 1);
        fVar1 = *pfVar7;
        pfVar7 = v_array<float>::operator[](&psVar3->krow,i_00);
        *pfVar7 = fVar1;
      }
      v_array<float>::pop(&psVar3->krow);
      local_2c = local_2c + -1;
    }
  }
  return local_2c;
}

Assistant:

int remove(svm_params& params, size_t svi)
{
  svm_model* model = params.model;
  if (svi >= model->num_support)
    params.all->trace_message << "Internal error at " << __FILE__ << ":" << __LINE__ << endl;
  // shift params fields
  svm_example* svi_e = model->support_vec[svi];
  for (size_t i = svi; i < model->num_support - 1; ++i)
  {
    model->support_vec[i] = model->support_vec[i + 1];
    model->alpha[i] = model->alpha[i + 1];
    model->delta[i] = model->delta[i + 1];
  }
  svi_e->~svm_example();
  free(svi_e);
  model->support_vec.pop();
  model->alpha.pop();
  model->delta.pop();
  model->num_support--;
  // shift cache
  int alloc = 0;
  for (size_t j = 0; j < model->num_support; j++)
  {
    svm_example* e = model->support_vec[j];
    size_t rowsize = e->krow.size();
    if (svi < rowsize)
    {
      for (size_t i = svi; i < rowsize - 1; i++) e->krow[i] = e->krow[i + 1];
      e->krow.pop();
      alloc -= 1;
    }
  }
  return alloc;
}